

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O1

void __thiscall
icu_63::CollationFastLatinBuilder::addContractionEntry
          (CollationFastLatinBuilder *this,int32_t x,int64_t cce0,int64_t cce1,UErrorCode *errorCode
          )

{
  UVector64 *this_00;
  int iVar1;
  UBool UVar2;
  
  this_00 = &this->contractionCEs;
  iVar1 = (this->contractionCEs).count;
  if ((iVar1 < -1) || ((this->contractionCEs).capacity <= iVar1)) {
    UVar2 = UVector64::expandCapacity(this_00,iVar1 + 1,errorCode);
    if (UVar2 != '\0') goto LAB_00239c31;
  }
  else {
LAB_00239c31:
    iVar1 = (this->contractionCEs).count;
    (this->contractionCEs).elements[iVar1] = (long)x;
    (this->contractionCEs).count = iVar1 + 1;
  }
  iVar1 = (this->contractionCEs).count;
  if ((iVar1 < -1) || ((this->contractionCEs).capacity <= iVar1)) {
    UVar2 = UVector64::expandCapacity(this_00,iVar1 + 1,errorCode);
    if (UVar2 != '\0') goto LAB_00239c76;
  }
  else {
LAB_00239c76:
    iVar1 = (this->contractionCEs).count;
    (this->contractionCEs).elements[iVar1] = cce0;
    (this->contractionCEs).count = iVar1 + 1;
  }
  iVar1 = (this->contractionCEs).count;
  if ((iVar1 < -1) || ((this->contractionCEs).capacity <= iVar1)) {
    UVar2 = UVector64::expandCapacity(this_00,iVar1 + 1,errorCode);
    if (UVar2 == '\0') goto LAB_00239cd4;
  }
  iVar1 = (this->contractionCEs).count;
  (this->contractionCEs).elements[iVar1] = cce1;
  (this->contractionCEs).count = iVar1 + 1;
LAB_00239cd4:
  addUniqueCE(this,cce0,errorCode);
  addUniqueCE(this,cce1,errorCode);
  return;
}

Assistant:

void
CollationFastLatinBuilder::addContractionEntry(int32_t x, int64_t cce0, int64_t cce1,
                                               UErrorCode &errorCode) {
    contractionCEs.addElement(x, errorCode);
    contractionCEs.addElement(cce0, errorCode);
    contractionCEs.addElement(cce1, errorCode);
    addUniqueCE(cce0, errorCode);
    addUniqueCE(cce1, errorCode);
}